

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

bool __thiscall r_exec::PGMOverlay::check_guards(PGMOverlay *this)

{
  ushort uVar1;
  byte bVar2;
  bool bVar3;
  short sVar4;
  ushort uVar5;
  
  sVar4 = r_code::Atom::asIndex();
  bVar2 = r_code::Atom::getAtomCount();
  uVar1 = 1;
  do {
    uVar5 = uVar1;
    if ((ushort)(uVar5 - bVar2) == 1) break;
    bVar3 = InputLessPGMOverlay::evaluate(&this->super_InputLessPGMOverlay,sVar4 + uVar5);
    uVar1 = uVar5 + 1;
  } while (bVar3);
  return bVar2 < uVar5;
}

Assistant:

bool PGMOverlay::check_guards()
{
    uint16_t guard_set_index = code[PGM_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        if (!evaluate(guard_set_index + i)) {
            return false;
        }
    }

    return true;
}